

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

uint8_t * skip_aux(uint8_t *s)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  
  bVar2 = *s;
  uVar4 = (uint)bVar2;
  uVar3 = 1;
  if (bVar2 < 0x5a) {
    switch(bVar2) {
    case 0x41:
    case 0x43:
      break;
    case 0x42:
    case 0x48:
switchD_00117daf_caseD_42:
      uVar3 = uVar4;
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
      goto switchD_00117daf_caseD_44;
    case 0x49:
      goto switchD_00117daf_caseD_49;
    default:
      if (uVar4 != 0x53) goto switchD_00117daf_caseD_44;
LAB_00117dda:
      uVar3 = 2;
    }
  }
  else {
    switch(bVar2) {
    case 99:
      break;
    case 100:
      uVar3 = 8;
      break;
    case 0x66:
    case 0x69:
switchD_00117daf_caseD_49:
      uVar3 = 4;
      break;
    default:
      if (bVar2 == 0x5a) goto switchD_00117daf_caseD_42;
      if (uVar4 == 0x73) goto LAB_00117dda;
    case 0x65:
    case 0x67:
    case 0x68:
switchD_00117daf_caseD_44:
      uVar3 = 0;
    }
  }
  pbVar5 = s + 1;
  if (uVar3 < 0x48) {
    if (uVar3 != 0x42) {
      if (uVar3 == 0) {
        abort();
      }
      goto LAB_00117e45;
    }
    bVar2 = *pbVar5;
    uVar4 = (uint)bVar2;
    uVar3 = 1;
    if (bVar2 < 0x5a) {
      switch(bVar2) {
      case 0x41:
      case 0x43:
        break;
      case 0x42:
      case 0x48:
switchD_00117e3f_caseD_42:
        uVar3 = uVar4;
        break;
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
        goto switchD_00117e3f_caseD_44;
      case 0x49:
        goto switchD_00117e3f_caseD_49;
      default:
        if (uVar4 != 0x53) goto switchD_00117e3f_caseD_44;
LAB_00117e78:
        uVar3 = 2;
      }
    }
    else {
      switch(bVar2) {
      case 99:
        break;
      case 100:
        uVar3 = 8;
        break;
      case 0x66:
      case 0x69:
switchD_00117e3f_caseD_49:
        uVar3 = 4;
        break;
      default:
        if (bVar2 == 0x5a) goto switchD_00117e3f_caseD_42;
        if (uVar4 == 0x73) goto LAB_00117e78;
      case 0x65:
      case 0x67:
      case 0x68:
switchD_00117e3f_caseD_44:
        uVar3 = 0;
      }
    }
    pbVar5 = s + (ulong)(uVar3 * *(int *)(s + 2)) + 6;
  }
  else {
    if ((uVar3 == 0x5a) || (uVar3 == 0x48)) {
      do {
        pbVar1 = pbVar5 + 1;
        bVar2 = *pbVar5;
        pbVar5 = pbVar1;
      } while (bVar2 != 0);
      return pbVar1;
    }
LAB_00117e45:
    pbVar5 = pbVar5 + uVar3;
  }
  return pbVar5;
}

Assistant:

static inline uint8_t *skip_aux(uint8_t *s)
{
    int size = aux_type2size(*s); ++s; // skip type
    uint32_t n;
    switch (size) {
    case 'Z':
    case 'H':
        while (*s) ++s;
        return s + 1;
    case 'B':
        size = aux_type2size(*s); ++s;
        memcpy(&n, s, 4); s += 4;
        return s + size * n;
    case 0:
        abort();
        break;
    default:
        return s + size;
    }
}